

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall maths::Matrix::transpose(Matrix *this)

{
  double **ppdVar1;
  long lVar2;
  double **ppdVar3;
  double **ppdVar4;
  double **ppdVar5;
  uint *in_RSI;
  int j;
  double **ppdVar6;
  Matrix MVar7;
  
  Matrix(this,in_RSI[1],*in_RSI);
  ppdVar5 = (double **)0x0;
  ppdVar4 = (double **)(ulong)in_RSI[1];
  if ((int)in_RSI[1] < 1) {
    ppdVar4 = ppdVar5;
  }
  ppdVar1 = this->p;
  ppdVar3 = (double **)(ulong)*in_RSI;
  if ((int)*in_RSI < 1) {
    ppdVar3 = ppdVar5;
  }
  for (; ppdVar5 != ppdVar3; ppdVar5 = (double **)((long)ppdVar5 + 1)) {
    lVar2 = *(long *)(in_RSI + 2);
    for (ppdVar6 = (double **)0x0; ppdVar4 != ppdVar6; ppdVar6 = (double **)((long)ppdVar6 + 1)) {
      ppdVar1[(long)ppdVar6][(long)ppdVar5] =
           *(double *)(*(long *)(lVar2 + (long)ppdVar5 * 8) + (long)ppdVar6 * 8);
    }
  }
  MVar7.p = ppdVar5;
  MVar7._0_8_ = this;
  return MVar7;
}

Assistant:

Matrix Matrix::transpose()
{
    Matrix ret(cols_, rows_);
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            ret.p[j][i] = p[i][j];
        }
    }
    return ret;
}